

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpPrepass::BeginSection
          (BinaryReaderObjdumpPrepass *this,Index section_index,BinarySection section_code,
          Offset size)

{
  ObjdumpState *pOVar1;
  char *__s;
  size_t sVar2;
  string_view name;
  
  BinaryReaderObjdumpBase::BeginSection
            (&this->super_BinaryReaderObjdumpBase,section_index,section_code,size);
  if (section_code != Custom) {
    pOVar1 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
    __s = GetSectionName(section_code);
    sVar2 = strlen(__s);
    name.size_ = sVar2;
    name.data_ = __s;
    ObjdumpNames::Set(&pOVar1->section_names,section_index,name);
  }
  return (Result)Ok;
}

Assistant:

Result BeginSection(Index section_index,
                      BinarySection section_code,
                      Offset size) override {
    BinaryReaderObjdumpBase::BeginSection(section_index, section_code, size);
    if (section_code != BinarySection::Custom) {
      objdump_state_->section_names.Set(section_index,
                                        wabt::GetSectionName(section_code));
    }
    return Result::Ok;
  }